

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O1

int32_t uloc_acceptLanguage_63
                  (char *result,int32_t resultAvailable,UAcceptResult *outResult,char **acceptList,
                  int32_t acceptListCount,UEnumeration *availableLocales,UErrorCode *status)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  int iVar4;
  void *buffer;
  char *pcVar5;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  char tmp [158];
  char local_d8 [168];
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    buffer = uprv_malloc_63((long)acceptListCount << 3);
    if (buffer == (void *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      if (acceptListCount < 1) {
        iVar7 = 0;
      }
      else {
        uVar9 = 0;
        iVar7 = 0;
        do {
          pcVar5 = uenum_next_63(availableLocales,(int32_t *)0x0,status);
          while (pcVar5 != (char *)0x0) {
            sVar6 = strlen(pcVar5);
            iVar2 = strcmp(acceptList[uVar9],pcVar5);
            iVar4 = (int)sVar6;
            if (iVar2 == 0) {
              if (outResult != (UAcceptResult *)0x0) {
                *outResult = ULOC_ACCEPT_VALID;
              }
              if (0 < iVar4) {
                iVar3 = uprv_min_63(iVar4,resultAvailable);
                strncpy(result,pcVar5,(long)iVar3);
              }
              if (uVar9 != 0) {
                uVar8 = 0;
                do {
                  uprv_free_63(*(void **)((long)buffer + uVar8 * 8));
                  uVar8 = uVar8 + 1;
                } while (uVar9 != uVar8);
              }
              uprv_free_63(buffer);
LAB_002b412d:
              iVar3 = u_terminateChars_63(result,resultAvailable,iVar4,status);
              return iVar3;
            }
            if (iVar4 < iVar7) {
              iVar4 = iVar7;
            }
            iVar7 = iVar4;
            pcVar5 = uenum_next_63(availableLocales,(int32_t *)0x0,status);
          }
          uenum_reset_63(availableLocales,status);
          iVar3 = uloc_getParent_63(acceptList[uVar9],local_d8,0x9e,status);
          if (iVar3 == 0) {
            pcVar5 = (char *)0x0;
          }
          else {
            pcVar5 = uprv_strdup_63(local_d8);
          }
          *(char **)((long)buffer + uVar9 * 8) = pcVar5;
          uVar9 = uVar9 + 1;
        } while (uVar9 != (uint)acceptListCount);
      }
      if (1 < iVar7) {
        do {
          if (0 < acceptListCount) {
            uVar9 = 0;
            do {
              pcVar5 = *(char **)((long)buffer + uVar9 * 8);
              if ((pcVar5 != (char *)0x0) && (sVar6 = strlen(pcVar5), iVar7 + -1 == (int)sVar6)) {
                while (pcVar5 = uenum_next_63(availableLocales,(int32_t *)0x0,status),
                      pcVar5 != (char *)0x0) {
                  iVar4 = strcmp(*(char **)((long)buffer + uVar9 * 8),pcVar5);
                  if (iVar4 == 0) {
                    sVar6 = strlen(pcVar5);
                    if (outResult != (UAcceptResult *)0x0) {
                      *outResult = ULOC_ACCEPT_FALLBACK;
                    }
                    iVar4 = (int)sVar6;
                    if (0 < iVar4) {
                      iVar3 = uprv_min_63(iVar4,resultAvailable);
                      strncpy(result,pcVar5,(long)iVar3);
                    }
                    uVar9 = 1;
                    if (1 < acceptListCount) {
                      uVar9 = (ulong)(uint)acceptListCount;
                    }
                    uVar8 = 0;
                    do {
                      uprv_free_63(*(void **)((long)buffer + uVar8 * 8));
                      uVar8 = uVar8 + 1;
                    } while (uVar9 != uVar8);
                    uprv_free_63(buffer);
                    goto LAB_002b412d;
                  }
                }
                uenum_reset_63(availableLocales,status);
                iVar3 = uloc_getParent_63(*(char **)((long)buffer + uVar9 * 8),local_d8,0x9e,status)
                ;
                uprv_free_63(*(void **)((long)buffer + uVar9 * 8));
                if (iVar3 == 0) {
                  pcVar5 = (char *)0x0;
                }
                else {
                  pcVar5 = uprv_strdup_63(local_d8);
                }
                *(char **)((long)buffer + uVar9 * 8) = pcVar5;
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != (uint)acceptListCount);
          }
          if (outResult != (UAcceptResult *)0x0) {
            *outResult = ULOC_ACCEPT_FAILED;
          }
          bVar1 = 2 < iVar7;
          iVar7 = iVar7 + -1;
        } while (bVar1);
      }
      if (0 < acceptListCount) {
        uVar9 = 0;
        do {
          uprv_free_63(*(void **)((long)buffer + uVar9 * 8));
          uVar9 = uVar9 + 1;
        } while ((uint)acceptListCount != uVar9);
      }
      uprv_free_63(buffer);
    }
  }
  return -1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_acceptLanguage(char *result, int32_t resultAvailable,
                    UAcceptResult *outResult, const char **acceptList,
                    int32_t acceptListCount,
                    UEnumeration* availableLocales,
                    UErrorCode *status)
{
    int32_t i,j;
    int32_t len;
    int32_t maxLen=0;
    char tmp[ULOC_FULLNAME_CAPACITY+1];
    const char *l;
    char **fallbackList;
    if(U_FAILURE(*status)) {
        return -1;
    }
    fallbackList = static_cast<char **>(uprv_malloc((size_t)(sizeof(fallbackList[0])*acceptListCount)));
    if(fallbackList==NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return -1;
    }
    for(i=0;i<acceptListCount;i++) {
#if defined(ULOC_DEBUG)
        fprintf(stderr,"%02d: %s\n", i, acceptList[i]);
#endif
        while((l=uenum_next(availableLocales, NULL, status)) != NULL) {
#if defined(ULOC_DEBUG)
            fprintf(stderr,"  %s\n", l);
#endif
            len = (int32_t)uprv_strlen(l);
            if(!uprv_strcmp(acceptList[i], l)) {
                if(outResult) {
                    *outResult = ULOC_ACCEPT_VALID;
                }
#if defined(ULOC_DEBUG)
                fprintf(stderr, "MATCH! %s\n", l);
#endif
                if(len>0) {
                    uprv_strncpy(result, l, uprv_min(len, resultAvailable));
                }
                for(j=0;j<i;j++) {
                    uprv_free(fallbackList[j]);
                }
                uprv_free(fallbackList);
                return u_terminateChars(result, resultAvailable, len, status);
            }
            if(len>maxLen) {
                maxLen = len;
            }
        }
        uenum_reset(availableLocales, status);
        /* save off parent info */
        if(uloc_getParent(acceptList[i], tmp, UPRV_LENGTHOF(tmp), status)!=0) {
            fallbackList[i] = uprv_strdup(tmp);
        } else {
            fallbackList[i]=0;
        }
    }

    for(maxLen--;maxLen>0;maxLen--) {
        for(i=0;i<acceptListCount;i++) {
            if(fallbackList[i] && ((int32_t)uprv_strlen(fallbackList[i])==maxLen)) {
#if defined(ULOC_DEBUG)
                fprintf(stderr,"Try: [%s]", fallbackList[i]);
#endif
                while((l=uenum_next(availableLocales, NULL, status)) != NULL) {
#if defined(ULOC_DEBUG)
                    fprintf(stderr,"  %s\n", l);
#endif
                    len = (int32_t)uprv_strlen(l);
                    if(!uprv_strcmp(fallbackList[i], l)) {
                        if(outResult) {
                            *outResult = ULOC_ACCEPT_FALLBACK;
                        }
#if defined(ULOC_DEBUG)
                        fprintf(stderr, "fallback MATCH! %s\n", l);
#endif
                        if(len>0) {
                            uprv_strncpy(result, l, uprv_min(len, resultAvailable));
                        }
                        for(j=0;j<acceptListCount;j++) {
                            uprv_free(fallbackList[j]);
                        }
                        uprv_free(fallbackList);
                        return u_terminateChars(result, resultAvailable, len, status);
                    }
                }
                uenum_reset(availableLocales, status);

                if(uloc_getParent(fallbackList[i], tmp, UPRV_LENGTHOF(tmp), status)!=0) {
                    uprv_free(fallbackList[i]);
                    fallbackList[i] = uprv_strdup(tmp);
                } else {
                    uprv_free(fallbackList[i]);
                    fallbackList[i]=0;
                }
            }
        }
        if(outResult) {
            *outResult = ULOC_ACCEPT_FAILED;
        }
    }
    for(i=0;i<acceptListCount;i++) {
        uprv_free(fallbackList[i]);
    }
    uprv_free(fallbackList);
    return -1;
}